

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationAngle.h
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationAngle::SetAngleFunction
          (ChLinkMotorRotationAngle *this,shared_ptr<chrono::ChFunction> *function)

{
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&function->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)(this + 0x250),
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void SetAngleFunction(const std::shared_ptr<ChFunction> function) { SetMotorFunction(function); }